

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIf.c
# Opt level: O3

int Abc_ObjCompareFlow(Abc_Obj_t **ppNode0,Abc_Obj_t **ppNode1)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if (((*ppNode0)->field_6).dTemp <= ((*ppNode1)->field_6).dTemp) {
    uVar1 = (uint)(((*ppNode0)->field_6).dTemp < ((*ppNode1)->field_6).dTemp);
  }
  return uVar1;
}

Assistant:

int Abc_ObjCompareFlow( Abc_Obj_t ** ppNode0, Abc_Obj_t ** ppNode1 )
{
    float Flow0 = Abc_Int2Float((int)(ABC_PTRINT_T)(*ppNode0)->pCopy);
    float Flow1 = Abc_Int2Float((int)(ABC_PTRINT_T)(*ppNode1)->pCopy);
    if ( Flow0 > Flow1 )
        return -1;
    if ( Flow0 < Flow1 )
        return 1;
    return 0;
}